

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O3

void __thiscall vigra::BmpDecoderImpl::read_data(BmpDecoderImpl *this)

{
  ushort uVar1;
  
  uVar1 = (this->info_header).bit_count;
  if (uVar1 < 8) {
    if (uVar1 == 1) {
      read_1bit_data(this);
    }
    else if (uVar1 == 4) {
      if ((this->info_header).compression == 0) {
        read_4bit_data(this);
      }
      else {
        read_rle4_data(this);
      }
    }
  }
  else if (uVar1 == 8) {
    if ((this->info_header).compression == 0) {
      read_8bit_data(this);
    }
    else {
      read_rle8_data(this);
    }
  }
  else if (uVar1 == 0x18) {
    read_rgb_data(this);
  }
  this->data_read = true;
  return;
}

Assistant:

void BmpDecoderImpl::read_data ()
{
    // read (and eventually map) the bands
    switch (info_header.bit_count) {
    case 1:
        read_1bit_data ();
        break;
    case 4:
        if (info_header.compression) {
            read_rle4_data ();
        } else {
            read_4bit_data ();
        } break;
    case 8:
        if (info_header.compression) {
            read_rle8_data ();
        } else {
            read_8bit_data ();
        } break;
    case 24:
        read_rgb_data ();
        break;
    }
    data_read = true;
}